

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

bool __thiscall
TPZMatrix<Fad<float>_>::SolveEigenvaluesJacobi
          (TPZMatrix<Fad<float>_> *this,int64_t *numiterations,REAL *tol,TPZVec<Fad<float>_> *Sort)

{
  double dVar1;
  bool bVar2;
  _Rb_tree_const_iterator<double> *this_00;
  Fad<float> *this_01;
  TPZVec<Fad<float>_> *in_RCX;
  double *in_RDX;
  long *in_RSI;
  TPZBaseMatrix *in_RDI;
  float fVar3;
  float fVar4;
  double dVar5;
  iterator e;
  iterator w;
  Fad<float> exps;
  multiset<double,_std::less<double>,_std::allocator<double>_> myset;
  Fad<float> Spq;
  Fad<float> Sqq;
  Fad<float> Spp;
  Fad<float> aux2;
  Fad<float> aux;
  Fad<float> sint;
  Fad<float> cost;
  Fad<float> theta;
  Fad<float> maxval;
  int64_t q;
  int64_t p;
  int64_t j;
  int64_t i;
  int64_t size;
  Fad<float> res;
  int64_t iter;
  undefined4 in_stack_fffffffffffff858;
  undefined4 in_stack_fffffffffffff85c;
  float in_stack_fffffffffffff860;
  int in_stack_fffffffffffff864;
  Fad<float> *in_stack_fffffffffffff868;
  Fad<float> *in_stack_fffffffffffff870;
  iterator in_stack_fffffffffffff878;
  Fad<float> *in_stack_fffffffffffff880;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>_>_>
  *in_stack_fffffffffffff888;
  Fad<float> *in_stack_fffffffffffff890;
  Fad<float> *in_stack_fffffffffffff898;
  Fad<float> *in_stack_fffffffffffff8a0;
  _Self local_668;
  _Rb_tree_const_iterator<double> local_660;
  _Base_ptr local_658;
  Fad<float> *local_630;
  undefined8 local_538;
  undefined8 local_480;
  undefined8 local_2a8;
  undefined8 local_248;
  float local_20c;
  undefined8 local_208;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  int64_t local_c0;
  undefined8 local_88;
  long local_30;
  TPZVec<Fad<float>_> *local_28;
  double *local_20;
  long *local_18;
  bool local_1;
  
  local_30 = 0;
  local_88 = 0x4000000000000000;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  Fad<float>::Fad<double,_nullptr>(in_stack_fffffffffffff870,(double *)in_stack_fffffffffffff868);
  Fad<float>::Fad<double,_nullptr>(in_stack_fffffffffffff870,(double *)in_stack_fffffffffffff868);
  operator*<Fad<float>,_Fad<float>,_nullptr>(in_stack_fffffffffffff898,in_stack_fffffffffffff890);
  Fad<float>::Fad<FadBinaryMul<Fad<float>,Fad<float>>>
            (in_stack_fffffffffffff8a0,
             (FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff898);
  FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)
             CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
  Fad<float>::~Fad((Fad<float> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
  Fad<float>::~Fad((Fad<float> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
  local_c0 = TPZBaseMatrix::Rows(in_RDI);
  local_d8 = -1;
  local_e0 = -1;
  Fad<float>::Fad(in_stack_fffffffffffff870);
  Fad<float>::Fad(in_stack_fffffffffffff870);
  Fad<float>::Fad(in_stack_fffffffffffff870);
  Fad<float>::Fad(in_stack_fffffffffffff870);
  Fad<float>::Fad(in_stack_fffffffffffff870);
  Fad<float>::Fad(in_stack_fffffffffffff870);
  Fad<float>::Fad(in_stack_fffffffffffff870);
  Fad<float>::Fad(in_stack_fffffffffffff870);
  Fad<float>::Fad(in_stack_fffffffffffff870);
  for (; local_30 < *local_18; local_30 = local_30 + 1) {
    local_208 = 0;
    Fad<float>::operator=<double,_nullptr>
              (in_stack_fffffffffffff870,(double *)in_stack_fffffffffffff868);
    for (local_c8 = 0; local_c8 < local_c0; local_c8 = local_c8 + 1) {
      for (local_d0 = 0; local_d0 < local_c8; local_d0 = local_d0 + 1) {
        operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
                   (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
        fVar3 = fabs<float>((Fad<float> *)0x131f4ba);
        fVar4 = fabs<float>((Fad<float> *)0x131f4d2);
        if (fVar4 < fVar3) {
          local_d8 = local_c8;
          local_e0 = local_d0;
          operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
                     (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
          local_20c = fabs<float>((Fad<float> *)0x131f54c);
          Fad<float>::operator=<float,_nullptr>
                    (in_stack_fffffffffffff870,&in_stack_fffffffffffff868->val_);
        }
      }
    }
    Fad<float>::operator=
              ((Fad<float> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
               (Fad<float> *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
    fVar3 = fabs<float>((Fad<float> *)0x131f745);
    if ((double)fVar3 < *local_20) break;
    local_248 = 0x3fe0000000000000;
    Fad<float>::Fad<double,_nullptr>(in_stack_fffffffffffff870,(double *)in_stack_fffffffffffff868);
    local_2a8 = 0x4000000000000000;
    Fad<float>::Fad<double,_nullptr>(in_stack_fffffffffffff870,(double *)in_stack_fffffffffffff868);
    operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
               (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
    operator*<Fad<float>,_Fad<float>,_nullptr>(in_stack_fffffffffffff898,in_stack_fffffffffffff890);
    operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
               (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
    operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
               (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
    operator-<Fad<float>,_Fad<float>,_nullptr>(in_stack_fffffffffffff898,in_stack_fffffffffffff890);
    operator/<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff898,
               (FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff890);
    atan<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,Fad<float>>>,FadExpr<FadBinaryMinus<Fad<float>,Fad<float>>>>>
              (in_stack_fffffffffffff888);
    operator*<Fad<float>,_FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>_>_>_>_>,_nullptr>
              (in_stack_fffffffffffff898,
               (FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>_>_>_>_>
                *)in_stack_fffffffffffff890);
    Fad<float>::operator=
              (in_stack_fffffffffffff880,
               (FadExpr<FadBinaryMul<Fad<float>,_FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>_>_>_>_>_>_>
                *)in_stack_fffffffffffff878._M_node);
    FadExpr<FadBinaryMul<Fad<float>,_FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<float>,_FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>_>_>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> *)
               CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)
               CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    Fad<float>::~Fad((Fad<float> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    Fad<float>::~Fad((Fad<float> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    cos<float>(in_stack_fffffffffffff898);
    Fad<float>::operator=
              (in_stack_fffffffffffff880,
               (FadExpr<FadFuncCos<Fad<float>_>_> *)in_stack_fffffffffffff878._M_node);
    FadExpr<FadFuncCos<Fad<float>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<Fad<float>_>_> *)
               CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    sin<float>(in_stack_fffffffffffff898);
    Fad<float>::operator=
              (in_stack_fffffffffffff880,
               (FadExpr<FadFuncSin<Fad<float>_>_> *)in_stack_fffffffffffff878._M_node);
    FadExpr<FadFuncSin<Fad<float>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<Fad<float>_>_> *)
               CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    for (local_c8 = 0; local_c8 < local_c0; local_c8 = local_c8 + 1) {
      if ((local_c8 != local_d8) && (local_c8 != local_e0)) {
        operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
                   (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
        Fad<float>::Fad(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
        operator*<Fad<float>,_Fad<float>,_nullptr>
                  (in_stack_fffffffffffff898,in_stack_fffffffffffff890);
        operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
                   (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
        Fad<float>::Fad(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
        operator*<Fad<float>,_Fad<float>,_nullptr>
                  (in_stack_fffffffffffff898,in_stack_fffffffffffff890);
        operator-<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff898,
                   (FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff890);
        Fad<float>::operator=
                  (in_stack_fffffffffffff880,
                   (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>
                    *)in_stack_fffffffffffff878._M_node);
        FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
        FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)
                   CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
        Fad<float>::~Fad((Fad<float> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860)
                        );
        FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)
                   CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
        Fad<float>::~Fad((Fad<float> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860)
                        );
        operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
                   (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
        Fad<float>::Fad(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
        operator*<Fad<float>,_Fad<float>,_nullptr>
                  (in_stack_fffffffffffff898,in_stack_fffffffffffff890);
        operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
                   (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
        Fad<float>::Fad(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
        operator*<Fad<float>,_Fad<float>,_nullptr>
                  (in_stack_fffffffffffff898,in_stack_fffffffffffff890);
        operator+<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff898,
                   (FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff890);
        Fad<float>::operator=
                  (in_stack_fffffffffffff880,
                   (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>
                    *)in_stack_fffffffffffff878._M_node);
        FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
        FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)
                   CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
        Fad<float>::~Fad((Fad<float> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860)
                        );
        FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)
                   CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
        Fad<float>::~Fad((Fad<float> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860)
                        );
        operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
                   (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
        Fad<float>::operator=
                  ((Fad<float> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                   (Fad<float> *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
        operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
                   (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
        Fad<float>::operator=
                  ((Fad<float> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                   (Fad<float> *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
        operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
                   (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
        Fad<float>::operator=
                  ((Fad<float> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                   (Fad<float> *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
        operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
                   (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
        Fad<float>::operator=
                  ((Fad<float> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                   (Fad<float> *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
      }
    }
    operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
               (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
    operator*<Fad<float>,_Fad<float>,_nullptr>(in_stack_fffffffffffff898,in_stack_fffffffffffff890);
    operator*<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff898,
               in_stack_fffffffffffff890);
    local_480 = 0x4000000000000000;
    Fad<float>::Fad<double,_nullptr>(in_stack_fffffffffffff870,(double *)in_stack_fffffffffffff868);
    operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
               (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
    operator*<Fad<float>,_Fad<float>,_nullptr>(in_stack_fffffffffffff898,in_stack_fffffffffffff890);
    operator*<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff898,
               in_stack_fffffffffffff890);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                *)in_stack_fffffffffffff898,in_stack_fffffffffffff890);
    operator-<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                *)in_stack_fffffffffffff898,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>
                *)in_stack_fffffffffffff890);
    operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
               (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
    operator*<Fad<float>,_Fad<float>,_nullptr>(in_stack_fffffffffffff898,in_stack_fffffffffffff890);
    operator*<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff898,
               in_stack_fffffffffffff890);
    operator+<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>_>_>
                *)in_stack_fffffffffffff898,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                *)in_stack_fffffffffffff890);
    Fad<float>::operator=
              (in_stack_fffffffffffff880,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>_>_>
                *)in_stack_fffffffffffff878._M_node);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)
               CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>
                *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)
               CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    Fad<float>::~Fad((Fad<float> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)
               CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
               (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
    operator*<Fad<float>,_Fad<float>,_nullptr>(in_stack_fffffffffffff898,in_stack_fffffffffffff890);
    operator*<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff898,
               in_stack_fffffffffffff890);
    local_538 = 0x4000000000000000;
    Fad<float>::Fad<double,_nullptr>(in_stack_fffffffffffff870,(double *)in_stack_fffffffffffff868);
    operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
               (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
    operator*<Fad<float>,_Fad<float>,_nullptr>(in_stack_fffffffffffff898,in_stack_fffffffffffff890);
    operator*<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff898,
               in_stack_fffffffffffff890);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                *)in_stack_fffffffffffff898,in_stack_fffffffffffff890);
    operator+<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                *)in_stack_fffffffffffff898,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>
                *)in_stack_fffffffffffff890);
    operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
               (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
    operator*<Fad<float>,_Fad<float>,_nullptr>(in_stack_fffffffffffff898,in_stack_fffffffffffff890);
    operator*<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff898,
               in_stack_fffffffffffff890);
    operator+<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>_>_>
                *)in_stack_fffffffffffff898,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                *)in_stack_fffffffffffff890);
    Fad<float>::operator=
              (in_stack_fffffffffffff880,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>_>_>
                *)in_stack_fffffffffffff878._M_node);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)
               CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>
                *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)
               CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    Fad<float>::~Fad((Fad<float> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)
               CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
               (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
    operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
               (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
    operator-<Fad<float>,_Fad<float>,_nullptr>(in_stack_fffffffffffff898,in_stack_fffffffffffff890);
    operator*<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>,_nullptr>
              ((FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff898,
               in_stack_fffffffffffff890);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                *)in_stack_fffffffffffff898,in_stack_fffffffffffff890);
    operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
               (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
    operator*<Fad<float>,_Fad<float>,_nullptr>(in_stack_fffffffffffff898,in_stack_fffffffffffff890);
    operator*<Fad<float>,_Fad<float>,_nullptr>(in_stack_fffffffffffff898,in_stack_fffffffffffff890);
    operator-<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff898,
               (FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffff890);
    operator*<Fad<float>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>,_nullptr>
              (in_stack_fffffffffffff898,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>
                *)in_stack_fffffffffffff890);
    operator+<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>
                *)in_stack_fffffffffffff898,
               (FadExpr<FadBinaryMul<Fad<float>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>_>_>
                *)in_stack_fffffffffffff890);
    Fad<float>::operator=
              (in_stack_fffffffffffff880,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>_>_>_>_>
                *)in_stack_fffffffffffff878._M_node);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMul<Fad<float>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<float>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)
               CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)
               CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>
                *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> *)
               CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
               (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
    Fad<float>::operator=
              ((Fad<float> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
               (Fad<float> *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
    operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
               (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
    Fad<float>::operator=
              ((Fad<float> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
               (Fad<float> *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
    in_stack_fffffffffffff898 =
         operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
                    (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
    Fad<float>::operator=
              ((Fad<float> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
               (Fad<float> *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
    in_stack_fffffffffffff890 =
         operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
                    (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
    Fad<float>::operator=
              ((Fad<float> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
               (Fad<float> *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
  }
  if (local_28 != (TPZVec<Fad<float>_> *)0x0) {
    std::multiset<double,_std::less<double>,_std::allocator<double>_>::multiset
              ((multiset<double,_std::less<double>,_std::allocator<double>_> *)0x1320b85);
    for (local_c8 = 0; local_c8 < local_c0; local_c8 = local_c8 + 1) {
      operator()((TPZMatrix<Fad<float>_> *)in_stack_fffffffffffff880,
                 (int64_t)in_stack_fffffffffffff878._M_node,(int64_t)in_stack_fffffffffffff870);
      Fad<float>::Fad(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
      Fad<float>::Fad(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
      in_stack_fffffffffffff880 =
           (Fad<float> *)TPZExtractVal::val<Fad<float>>((Fad<float> *)0x1320bfe);
      local_630 = in_stack_fffffffffffff880;
      in_stack_fffffffffffff878 =
           std::multiset<double,_std::less<double>,_std::allocator<double>_>::insert
                     ((multiset<double,_std::less<double>,_std::allocator<double>_> *)
                      in_stack_fffffffffffff868,
                      (value_type_conflict1 *)
                      CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
      local_658 = in_stack_fffffffffffff878._M_node;
      Fad<float>::~Fad((Fad<float> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
      Fad<float>::~Fad((Fad<float> *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    }
    (*local_28->_vptr_TPZVec[3])(local_28,local_c0);
    std::_Rb_tree_const_iterator<double>::_Rb_tree_const_iterator(&local_660);
    local_668._M_node =
         (_Base_ptr)
         std::multiset<double,_std::less<double>,_std::allocator<double>_>::end
                   ((multiset<double,_std::less<double>,_std::allocator<double>_> *)
                    CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
    local_c8 = local_c0 + -1;
    local_660._M_node =
         (_Base_ptr)
         std::multiset<double,_std::less<double>,_std::allocator<double>_>::begin
                   ((multiset<double,_std::less<double>,_std::allocator<double>_> *)
                    CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
    while (bVar2 = std::operator!=(&local_660,&local_668), bVar2) {
      this_00 = (_Rb_tree_const_iterator<double> *)
                std::_Rb_tree_const_iterator<double>::operator*
                          ((_Rb_tree_const_iterator<double> *)0x1320d71);
      this_01 = TPZVec<Fad<float>_>::operator[](local_28,local_c8);
      Fad<float>::operator=<double,_nullptr>(this_01,(double *)this_00);
      std::_Rb_tree_const_iterator<double>::operator++(this_00,in_stack_fffffffffffff864);
      local_c8 = local_c8 + -1;
    }
    std::multiset<double,_std::less<double>,_std::allocator<double>_>::~multiset
              ((multiset<double,_std::less<double>,_std::allocator<double>_> *)0x1320de2);
  }
  fVar3 = fabs<float>((Fad<float> *)0x1320e03);
  dVar5 = (double)fVar3;
  dVar1 = *local_20;
  if (dVar1 <= dVar5) {
    fVar4 = fabs<float>((Fad<float> *)0x1320e87);
    *local_20 = (double)fVar4;
    *local_18 = local_30;
  }
  else {
    in_stack_fffffffffffff860 = fabs<float>((Fad<float> *)0x1320e34);
    *local_20 = (double)in_stack_fffffffffffff860;
    *local_18 = local_30;
  }
  local_1 = dVar1 > dVar5;
  Fad<float>::~Fad((Fad<float> *)CONCAT44(fVar3,in_stack_fffffffffffff860));
  Fad<float>::~Fad((Fad<float> *)CONCAT44(fVar3,in_stack_fffffffffffff860));
  Fad<float>::~Fad((Fad<float> *)CONCAT44(fVar3,in_stack_fffffffffffff860));
  Fad<float>::~Fad((Fad<float> *)CONCAT44(fVar3,in_stack_fffffffffffff860));
  Fad<float>::~Fad((Fad<float> *)CONCAT44(fVar3,in_stack_fffffffffffff860));
  Fad<float>::~Fad((Fad<float> *)CONCAT44(fVar3,in_stack_fffffffffffff860));
  Fad<float>::~Fad((Fad<float> *)CONCAT44(fVar3,in_stack_fffffffffffff860));
  Fad<float>::~Fad((Fad<float> *)CONCAT44(fVar3,in_stack_fffffffffffff860));
  Fad<float>::~Fad((Fad<float> *)CONCAT44(fVar3,in_stack_fffffffffffff860));
  Fad<float>::~Fad((Fad<float> *)CONCAT44(fVar3,in_stack_fffffffffffff860));
  return (bool)(local_1 & 1);
}

Assistant:

bool TPZMatrix<TVar>::SolveEigenvaluesJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> * Sort){
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols()){
		PZError << __PRETTY_FUNCTION__ << " - Jacobi method of computing eigenvalues requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false){
		PZError << __PRETTY_FUNCTION__ << " - Jacobi method of computing eigenvalues requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	int64_t iter = 0;
	TVar res = (TVar)2. * (TVar)tol;
	const int64_t size = this->Rows();
	int64_t i, j;
	int64_t p = -1, q = -1;
	TVar maxval, theta, cost, sint, aux, aux2, Spp, Sqq, Spq;
	while (iter < numiterations){
		/** First of all find the max value off diagonal */
		maxval = 0.;
		for(i = 0; i < size; i++){
			for(j = 0; j < i; j++) {
				if( fabs(this->operator ( )(i,j) ) > fabs(maxval) ) {
					p = i;
					q = j;
					maxval = fabs( this->operator ( )(i,j) );
				}//if
			}//for j
		}//for i
		
		/** Check if max value off diagonal is lesser than required tolerance */
		res = maxval;
		if ((REAL)(fabs(res)) < tol) break;
		
		/** Compute angle of rotation */
		theta = (TVar)0.5 * atan((TVar)2. * this->operator ( )(p,q) / (this->operator ( )(q,q) - this->operator ( )(p,p) ) );
		cost = cos(theta);
		sint = sin(theta);
		
		/** Apply rotation */
		for(i = 0; i < size; i++){
			if (i != p && i != q){
				
				aux = this->operator ( )(i,p) * (TVar)cost - this->operator ( )(i,q) * (TVar)sint;
				aux2 = this->operator ( )(i,p) * (TVar)sint + this->operator ( )(i,q) * (TVar)cost;
				
				this->operator ( )(i,p) = aux;
				this->operator ( )(p,i) = aux;
				
				this->operator ( )(i,q) = aux2;
				this->operator ( )(q,i) = aux2;
				
			}//if
		}//for i
		
		Spp = this->operator ( )(p,p) * cost * cost -(TVar)2. * this->operator ( )(p,q) * sint * cost + this->operator ( )(q,q) * sint * sint;
		Sqq = this->operator ( )(p,p) * sint * sint +(TVar)2. * this->operator ( )(p,q) * sint * cost + this->operator ( )(q,q) * cost * cost;
		Spq = ( this->operator ( )(p,p) - this->operator ( )(q,q) ) * cost * sint + this->operator ( )(p,q)*( cost*cost - sint*sint );
		
		this->operator ( )(p,p) = Spp;
		this->operator ( )(q,q) = Sqq;
		this->operator ( )(p,q) = Spq;
		this->operator ( )(q,p) = Spq;
		
		iter++;
	}//while
	
	/** Sorting */
	if (Sort){
		multiset< REAL > myset;
		for(i = 0; i < size; i++)
        {   TVar exps = this->operator ( )(i,i);
            myset.insert( (TPZExtractVal::val(exps)) );
        }
		
#ifdef PZDEBUG2
		if ((int64_t)myset.size() != size) PZError << __PRETTY_FUNCTION__ << " - ERROR!" << endl;
#endif
		
		Sort->Resize(size);
		multiset< REAL >::iterator w, e = myset.end();
		for(i = size - 1, w = myset.begin(); w != e; w++, i--){
			Sort->operator [ ](i) = *w;
		}//for
	}//if (Sort)
	
	
	if ((REAL)(fabs(res)) < tol){
		tol = fabs(res);
		numiterations = iter;
		return true;
	}
	
	tol = fabs(res);
	numiterations = iter;
	return false;
	
}